

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmGen12TextureCalc::GetCCSExMode(GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *AuxSurf)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  GMM_STATUS GVar2;
  uint uVar3;
  
  GVar2 = GMM_SUCCESS;
  if ((*(uint *)&(AuxSurf->Flags).Info.field_0x2 & 0x18500008) != 0) {
    aVar1 = (AuxSurf->Flags).Gpu;
    if (((((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
           super_GmmTextureCalc.pGmmLibContext)->SkuTable).field_1.field_0x2 & 4) == 0) {
      (AuxSurf->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar1 | 0x20000000000);
      if (AuxSurf->Type == RESOURCE_CUBE) {
        AuxSurf->ArraySize = 6;
      }
      AuxSurf->Type = RESOURCE_2D;
    }
    else {
      (AuxSurf->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar1 | 0x80000000000);
      if (((ulong)aVar1 & 0x20000000000) == 0) {
        return GMM_SUCCESS;
      }
    }
    AuxSurf->CCSModeAlign = 0;
    GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,AuxSurf);
    uVar3 = 0x60;
    if (0xc < (int)AuxSurf->TileMode) {
      uVar3 = AuxSurf->TileMode - TILE_YF_2D_8bpe;
    }
    AuxSurf->CCSModeAlign = uVar3;
    AuxSurf->TileMode = TILE_NONE;
    GVar2 = (uint)(0x5f < uVar3) * 2;
  }
  return GVar2;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen12TextureCalc::GetCCSExMode(GMM_TEXTURE_INFO *AuxSurf)
{
    if(GMM_IS_4KB_TILE(AuxSurf->Flags) || GMM_IS_64KB_TILE(AuxSurf->Flags) || AuxSurf->Flags.Info.Linear)
    {
        if(pGmmLibContext->GetSkuTable().FtrLinearCCS)
 	{
            AuxSurf->Flags.Gpu.__NonMsaaLinearCCS = 1;
        }
        else
        {
            AuxSurf->Flags.Gpu.__NonMsaaTileYCcs = 1;
            //CCS is always 2D, even for 3D surface
            if(AuxSurf->Type == RESOURCE_CUBE)
            {
                AuxSurf->ArraySize = 6;
            }
            AuxSurf->Type = RESOURCE_2D;
        }
        if(AuxSurf->Flags.Gpu.__NonMsaaTileYCcs)
        {
            AuxSurf->CCSModeAlign = 0;
            SetTileMode(AuxSurf);
            /*if (AuxSurf->Flags.Gpu.UnifiedAuxSurface)*/
            {
                AuxSurf->CCSModeAlign = CCS_MODE(AuxSurf->TileMode);
            }
            AuxSurf->TileMode = TILE_NONE;

            __GMM_ASSERT(AuxSurf->CCSModeAlign < CCS_MODES);
            return (AuxSurf->CCSModeAlign < CCS_MODES) ? GMM_SUCCESS : GMM_INVALIDPARAM;
        }
    }
    return GMM_SUCCESS;
}